

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

void assign_objmenu_accelerators(win_objmenu *mdat)

{
  char local_15;
  wchar_t local_14;
  char accel;
  wchar_t i;
  win_objmenu *mdat_local;
  
  local_15 = 'a';
  for (local_14 = L'\0'; local_14 < mdat->icount; local_14 = local_14 + L'\x01') {
    if (((mdat->items[local_14].accel == '\0') && (mdat->items[local_14].role == MI_NORMAL)) &&
       (mdat->items[local_14].id != L'\0')) {
      mdat->items[local_14].accel = local_15;
      if (local_15 == 'z') {
        local_15 = 'A';
      }
      else if (local_15 == 'Z') {
        local_15 = 'a';
      }
      else {
        local_15 = local_15 + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void assign_objmenu_accelerators(struct win_objmenu *mdat)
{
    int i;
    char accel = 'a';
    
    for (i = 0; i < mdat->icount; i++) {
	
	if (mdat->items[i].accel || mdat->items[i].role != MI_NORMAL ||
	    mdat->items[i].id == 0)
	    continue;
	
	mdat->items[i].accel = accel;
	
	if (accel == 'z')
	    accel = 'A';
	else if (accel == 'Z')
	    accel = 'a';
	else
	    accel++;
    }
}